

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# textSubtitlesRender.cpp
# Opt level: O1

string * text_subtitles::findFontArg(string *__return_storage_ptr__,string *text,size_t pos)

{
  char cVar1;
  ulong uVar2;
  bool bVar3;
  
  if (pos < text->_M_string_length) {
    bVar3 = false;
    uVar2 = 0;
    do {
      cVar1 = (text->_M_dataplus)._M_p[pos];
      if (cVar1 == '=') {
        bVar3 = true;
      }
      else if (bVar3) {
        if (cVar1 == ' ') {
          if (uVar2 != 0) goto LAB_001d35ce;
          uVar2 = 0;
        }
        else if (uVar2 == 0) {
          uVar2 = pos;
        }
      }
      pos = pos + 1;
    } while (text->_M_string_length != pos);
  }
  else {
    uVar2 = 0;
  }
  if (uVar2 == 0) {
    (__return_storage_ptr__->_M_dataplus)._M_p = (pointer)&__return_storage_ptr__->field_2;
    std::__cxx11::string::_M_construct<char_const*>((string *)__return_storage_ptr__,"");
  }
  else {
LAB_001d35ce:
    std::__cxx11::string::substr((ulong)__return_storage_ptr__,(ulong)text);
  }
  return __return_storage_ptr__;
}

Assistant:

string findFontArg(const string& text, const size_t pos)
{
    bool delFound = false;
    size_t firstPos = 0;
    for (size_t i = pos; i < text.size(); i++)
    {
        if (text[i] == '=')
            delFound = true;
        else if (delFound)
        {
            if (text[i] == ' ')
            {
                if (firstPos != 0)
                    return text.substr(firstPos, i - firstPos);
            }
            else if (firstPos == 0)
                firstPos = i;
        }
    }
    if (firstPos != 0)
        return text.substr(firstPos, text.size() - firstPos);
    return "";
}